

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O2

void __thiscall
coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::~basic_seq_coro_file
          (basic_seq_coro_file<(coro_io::execution_type)1> *this)

{
  std::__cxx11::string::~string((string *)&this->file_path_);
  std::fstream::~fstream(&this->frw_seq_file_);
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
  ~ExecutorWrapper(&this->executor_wrapper_);
  return;
}

Assistant:

basic_seq_coro_file(coro_io::ExecutorWrapper<> *executor =
                          coro_io::get_global_block_executor())
      : basic_seq_coro_file(executor->get_asio_executor()) {}